

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::TextureCubeArrayView::sample
          (TextureCubeArrayView *this,Sampler *sampler,float s,float t,float r,float q,float lod)

{
  int slice;
  int iVar1;
  Sampler *in_RDX;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  Vec4 VVar2;
  CubeFaceFloatCoords CVar3;
  int faceDepth;
  int layer;
  float local_58;
  Vector<float,_3> local_4c;
  undefined8 local_40;
  CubeFaceFloatCoords coords;
  float lod_local;
  float q_local;
  float r_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  TextureCubeArrayView *this_local;
  
  coords.s = lod;
  coords.t = q;
  Vector<float,_3>::Vector(&local_4c,s,t,r);
  CVar3 = getCubeFaceCoords(&local_4c);
  _faceDepth = CVar3._0_8_;
  local_40 = _faceDepth;
  local_58 = CVar3.t;
  coords.face = (CubeFace)local_58;
  slice = selectLayer((TextureCubeArrayView *)sampler,coords.t);
  iVar1 = getCubeArrayFaceIndex((CubeFace)local_40);
  if ((in_RDX->seamlessCubeMap & 1U) == 0) {
    VVar2 = sampleLevelArray2D((tcu *)this,*(ConstPixelBufferAccess **)&sampler->wrapR,
                               sampler->wrapS,in_RDX,local_40._4_4_,(float)coords.face,
                               slice * 6 + iVar1,coords.s);
  }
  else {
    VVar2 = sampleCubeArraySeamless
                      ((tcu *)this,*(ConstPixelBufferAccess **)&sampler->wrapR,sampler->wrapS,slice,
                       (CubeFace)local_40,in_RDX,local_40._4_4_,(float)coords.face,coords.s);
  }
  VVar2.m_data[0] = VVar2.m_data[0];
  auVar4._4_4_ = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  register0x00001244 = VVar2.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

tcu::Vec4 TextureCubeArrayView::sample (const Sampler& sampler, float s, float t, float r, float q, float lod) const
{
	const CubeFaceFloatCoords	coords		= getCubeFaceCoords(Vec3(s, t, r));
	const int					layer		= selectLayer(q);
	const int					faceDepth	= (layer * 6) + getCubeArrayFaceIndex(coords.face);

	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	if (sampler.seamlessCubeMap)
		return sampleCubeArraySeamless(m_levels, m_numLevels, layer, coords.face, sampler, coords.s, coords.t, lod);
	else
		return sampleLevelArray2D(m_levels, m_numLevels, sampler, coords.s, coords.t, faceDepth, lod);
}